

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O1

void deqp::egl::Image::framebufferRenderbuffer(Functions *gl,GLenum attachment,GLuint rbo)

{
  GLenum GVar1;
  NotSupportedError *this;
  char *__s;
  long *plVar2;
  long *plVar3;
  allocator<char> local_81;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (*gl->framebufferRenderbuffer)(0x8d40,attachment,0x8d41,rbo);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"framebufferRenderbuffer(GL_FRAMEBUFFER, attachment, GL_RENDERBUFFER, rbo)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                  ,0x167);
  GVar1 = (*gl->checkFramebufferStatus)(0x8d40);
  if (GVar1 == 0x8cd5) {
    return;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  __s = glu::getFramebufferAttachmentName(attachment);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,__s,&local_81);
  std::operator+(&local_40,"EGLImage as ",&local_60);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_80 = (long *)*plVar2;
  plVar3 = plVar2 + 2;
  if (local_80 == plVar3) {
    local_70 = *plVar3;
    lStack_68 = plVar2[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar3;
  }
  local_78 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  tcu::NotSupportedError::NotSupportedError
            (this,(char *)local_80,
             "gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
             ,0x16a);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

static void framebufferRenderbuffer (const glw::Functions& gl, GLenum attachment, GLuint rbo)
{
	GLU_CHECK_GLW_CALL(gl, framebufferRenderbuffer(GL_FRAMEBUFFER, attachment, GL_RENDERBUFFER, rbo));
	TCU_CHECK_AND_THROW(NotSupportedError,
						gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE,
						("EGLImage as " + string(glu::getFramebufferAttachmentName(attachment)) + " not supported").c_str());
}